

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineOffsetCache.cpp
# Opt level: O1

void __thiscall
Js::LineOffsetCache::LineOffsetCache
          (LineOffsetCache *this,Recycler *allocator,LPCUTF8 sourceStartCharacter,
          LPCUTF8 sourceEndCharacter,charcount_t startingCharacterOffset,
          charcount_t startingByteOffset)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  (this->lineCharacterOffsetCacheList).ptr =
       (ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *)0x0;
  (this->lineByteOffsetCacheList).ptr =
       (ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *)0x0;
  if (allocator == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/LineOffsetCache.cpp"
                                ,0x23,"(allocator)",
                                "An allocator must be supplied to the cache for allocation of items."
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  BuildCache(this,allocator,sourceStartCharacter,sourceEndCharacter,startingCharacterOffset,
             startingByteOffset);
  return;
}

Assistant:

LineOffsetCache::LineOffsetCache(Recycler* allocator,
        _In_z_ LPCUTF8 sourceStartCharacter,
        _In_z_ LPCUTF8 sourceEndCharacter,
        charcount_t startingCharacterOffset,
        charcount_t startingByteOffset) :
        lineCharacterOffsetCacheList(nullptr),
        lineByteOffsetCacheList(nullptr)
    {
        AssertMsg(allocator, "An allocator must be supplied to the cache for allocation of items.");
        this->BuildCache(allocator, sourceStartCharacter, sourceEndCharacter, startingCharacterOffset, startingByteOffset);
    }